

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  ulong immediateTypeTag;
  sysbvm_tuple_t sVar2;
  anon_struct_64_8_e166d2b6 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t sStack_b0;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t *psStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_stackFrameRecord_t local_70;
  undefined8 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *puStack_40;
  sysbvm_tuple_t *local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t local_28;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  psStack_a0 = (sysbvm_tuple_t *)0x0;
  local_b8 = 0;
  sStack_b0 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 8;
  puStack_40 = (undefined1 *)&local_b8;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_60 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_70);
  local_a8 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,*(sysbvm_tuple_t *)(*arguments + 0x28),
                        (context->roots).directTypeInferenceType,arguments[1]);
  if ((local_a8 & 0xf) == 0 && local_a8 != 0) {
    psStack_a0 = *(sysbvm_tuple_t **)(local_a8 + 0x20);
  }
  else {
    psStack_a0 = (sysbvm_tuple_t *)0x0;
  }
  immediateTypeTag = (ulong)psStack_a0 & 0xf;
  if (immediateTypeTag == 0 && psStack_a0 != (sysbvm_tuple_t *)0x0) {
    sVar2 = *psStack_a0;
  }
  else if ((int)immediateTypeTag == 0xf) {
    sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_a0 >> 4);
  }
  else {
    sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  local_98 = sysbvm_type_getAnalyzeUnexpandedApplicationNodeWithEnvironmentFunction(context,sVar2);
  if (local_98 == 0) {
    _Var1 = sysbvm_astNode_isMacroExpression(context,local_a8);
    if (_Var1) {
      _Var1 = sysbvm_astNode_isLiteralNode(context,local_a8);
      if (!_Var1) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:2177: assertion failure: sysbvm_astNode_isLiteralNode(context, gcFrame.functionOrMacroExpression)"
                  );
      }
      local_b8 = sysbvm_astLiteralNode_getValue(local_a8);
      sStack_90 = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                            (context,arguments,&local_b8,arguments + 1);
      sysbvm_stackFrame_popRecord(&local_70);
      sysbvm_stackFrame_popRecord(&local_58);
      sVar2 = sStack_90;
    }
    else {
      local_88 = sysbvm_astFunctionApplicationNode_create
                           (context,*(sysbvm_tuple_t *)(*arguments + 0x10),local_a8,
                            *(sysbvm_tuple_t *)(*arguments + 0x30));
      sysbvm_stackFrame_popRecord(&local_70);
      sysbvm_stackFrame_popRecord(&local_58);
      sVar2 = local_88;
    }
    sStack_80 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                          (context,sVar2,arguments[1]);
  }
  else {
    sStack_b0 = sysbvm_context_shallowCopy(context,*arguments);
    *(sysbvm_tuple_t *)(sStack_b0 + 0x28) = local_a8;
    local_28 = arguments[1];
    local_38 = psStack_a0;
    local_30 = sStack_b0;
    sStack_80 = sysbvm_function_apply(context,local_98,3,(sysbvm_tuple_t *)&local_38,0);
    sysbvm_stackFrame_popRecord(&local_70);
    sysbvm_stackFrame_popRecord(&local_58);
  }
  return sStack_80;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t macro;
        sysbvm_astUnexpandedApplicationNode_t *unexpandedNode;
        sysbvm_tuple_t functionOrMacroExpression;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t applicationNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacroExpression = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.functionOrMacroExpression);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeUnexpandedApplicationNodeWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*unexpandedNode);
        gcFrame.unexpandedNode->functionOrMacroExpression = gcFrame.functionOrMacroExpression;

        gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)gcFrame.unexpandedNode, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    // Is this a macro?
    bool isMacro = sysbvm_astNode_isMacroExpression(context, gcFrame.functionOrMacroExpression);
    if(isMacro)
    {
        SYSBVM_ASSERT(sysbvm_astNode_isLiteralNode(context, gcFrame.functionOrMacroExpression));
        gcFrame.macro = sysbvm_astLiteralNode_getValue(gcFrame.functionOrMacroExpression);
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.macro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Convert into application node and then analyze it.
    gcFrame.applicationNode = sysbvm_astFunctionApplicationNode_create(context, (*unexpandedNode)->super.sourcePosition, gcFrame.functionOrMacroExpression, (*unexpandedNode)->arguments);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.applicationNode, *environment);
}